

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_refs.cpp
# Opt level: O1

void set_lt_cfg_to_frm(EncFrmStatus *frm,RefsCnt *lt_cfg)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = frm->val;
  frm->val = uVar1 & 0xffffffffffffff3f | 0x80;
  uVar2 = (ulong)((lt_cfg->tid & 0xfU) << 0xc);
  frm->val = uVar1 & 0xffffffffffff0f3f | 0x80 | uVar2;
  uVar3 = (ulong)((lt_cfg->lt_idx & 0xfU) << 8);
  frm->val = uVar1 & 0xffffffffffff003f | 0x80 | uVar2 | uVar3;
  if (lt_cfg->ref_mode != REF_TO_ST_REF_SETUP) {
    uVar4 = (ulong)((lt_cfg->ref_mode & 0x3f) << 0x10);
    frm->val = uVar1 & 0xffffffffffc0003f | 0x80 | uVar2 | uVar3 | uVar4;
    frm->val = uVar1 & 0xffffffffc000003f | 0x80 | uVar2 | uVar3 | uVar4 |
               (ulong)((lt_cfg->ref_arg & 0xffU) << 0x16);
  }
  if (((byte)enc_refs_debug & 4) == 0) {
    return;
  }
  _dump_frm(frm,"set_lt_cfg_to_frm",0x15f);
  return;
}

Assistant:

static void set_lt_cfg_to_frm(EncFrmStatus *frm, RefsCnt *lt_cfg)
{
    frm->is_non_ref = 0;
    frm->is_lt_ref = 1;
    frm->temporal_id = lt_cfg->tid;
    frm->lt_idx = lt_cfg->lt_idx;

    if (lt_cfg->ref_mode != REF_TO_ST_REF_SETUP) {
        frm->ref_mode = lt_cfg->ref_mode;
        frm->ref_arg = lt_cfg->ref_arg;
    }

    if (enc_refs_debug & MPP_ENC_REFS_DBG_FRM)
        dump_frm(frm);
}